

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Op __thiscall spv::Builder::getMostBasicTypeClass(Builder *this,Id typeId)

{
  Id IVar1;
  Instruction *this_00;
  Op typeClass;
  Instruction *instr;
  Id typeId_local;
  Builder *this_local;
  
  this_00 = Module::getInstruction(&this->module,typeId);
  this_local._4_4_ = spv::Instruction::getOpCode(this_00);
  if ((this_local._4_4_ - OpTypeVector < 2) || (this_local._4_4_ - OpTypeArray < 2)) {
    IVar1 = spv::Instruction::getIdOperand(this_00,0);
    this_local._4_4_ = getMostBasicTypeClass(this,IVar1);
  }
  else if (this_local._4_4_ == OpTypePointer) {
    IVar1 = spv::Instruction::getIdOperand(this_00,1);
    this_local._4_4_ = getMostBasicTypeClass(this,IVar1);
  }
  return this_local._4_4_;
}

Assistant:

Op Builder::getMostBasicTypeClass(Id typeId) const
{
    Instruction* instr = module.getInstruction(typeId);

    Op typeClass = instr->getOpCode();
    switch (typeClass)
    {
    case OpTypeVector:
    case OpTypeMatrix:
    case OpTypeArray:
    case OpTypeRuntimeArray:
        return getMostBasicTypeClass(instr->getIdOperand(0));
    case OpTypePointer:
        return getMostBasicTypeClass(instr->getIdOperand(1));
    default:
        return typeClass;
    }
}